

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O2

bool mkvparser::Colour::Parse
               (IMkvReader *reader,longlong colour_start,longlong colour_size,Colour **colour)

{
  unique_ptr<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_> uVar1;
  longlong lVar2;
  longlong lVar3;
  bool bVar4;
  long lVar5;
  bool bVar6;
  long stop;
  unique_ptr<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_> colour_ptr;
  longlong read_pos;
  longlong child_size;
  longlong child_id;
  
  if ((reader == (IMkvReader *)0x0) || (*colour != (Colour *)0x0)) {
    bVar6 = false;
  }
  else {
    colour_ptr._M_t.
    super___uniq_ptr_impl<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_>._M_t.
    super__Tuple_impl<0UL,_mkvparser::Colour_*,_std::default_delete<mkvparser::Colour>_>.
    super__Head_base<0UL,_mkvparser::Colour_*,_false>._M_head_impl =
         (__uniq_ptr_data<mkvparser::Colour,_std::default_delete<mkvparser::Colour>,_true,_true>)
         operator_new(0x70,(nothrow_t *)&std::nothrow);
    if ((tuple<mkvparser::Colour_*,_std::default_delete<mkvparser::Colour>_>)
        colour_ptr._M_t.
        super___uniq_ptr_impl<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_>._M_t.
        super__Tuple_impl<0UL,_mkvparser::Colour_*,_std::default_delete<mkvparser::Colour>_>.
        super__Head_base<0UL,_mkvparser::Colour_*,_false>._M_head_impl ==
        (_Head_base<0UL,_mkvparser::Colour_*,_false>)0x0) {
      colour_ptr._M_t.
      super___uniq_ptr_impl<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_>._M_t.
      super__Tuple_impl<0UL,_mkvparser::Colour_*,_std::default_delete<mkvparser::Colour>_>.
      super__Head_base<0UL,_mkvparser::Colour_*,_false>._M_head_impl =
           (__uniq_ptr_data<mkvparser::Colour,_std::default_delete<mkvparser::Colour>,_true,_true>)
           (__uniq_ptr_impl<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_>)0x0;
      bVar6 = false;
    }
    else {
      Colour((Colour *)
             colour_ptr._M_t.
             super___uniq_ptr_impl<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_>._M_t.
             super__Tuple_impl<0UL,_mkvparser::Colour_*,_std::default_delete<mkvparser::Colour>_>.
             super__Head_base<0UL,_mkvparser::Colour_*,_false>._M_head_impl);
      stop = colour_size + colour_start;
      read_pos = colour_start;
      do {
        uVar1._M_t.super___uniq_ptr_impl<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_>
        ._M_t.super__Tuple_impl<0UL,_mkvparser::Colour_*,_std::default_delete<mkvparser::Colour>_>.
        super__Head_base<0UL,_mkvparser::Colour_*,_false>._M_head_impl =
             colour_ptr._M_t.
             super___uniq_ptr_impl<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_>._M_t.
             super__Tuple_impl<0UL,_mkvparser::Colour_*,_std::default_delete<mkvparser::Colour>_>.
             super__Head_base<0UL,_mkvparser::Colour_*,_false>._M_head_impl;
        bVar6 = stop <= read_pos;
        if (stop <= read_pos) {
          colour_ptr._M_t.
          super___uniq_ptr_impl<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_>._M_t.
          super__Tuple_impl<0UL,_mkvparser::Colour_*,_std::default_delete<mkvparser::Colour>_>.
          super__Head_base<0UL,_mkvparser::Colour_*,_false>._M_head_impl =
               (__uniq_ptr_data<mkvparser::Colour,_std::default_delete<mkvparser::Colour>,_true,_true>
                )(__uniq_ptr_impl<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_>)0x0;
          *colour = (Colour *)
                    uVar1._M_t.
                    super___uniq_ptr_impl<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_mkvparser::Colour_*,_std::default_delete<mkvparser::Colour>_>
                    .super__Head_base<0UL,_mkvparser::Colour_*,_false>._M_head_impl;
          break;
        }
        child_id = 0;
        child_size = 0;
        lVar5 = ParseElementHeader(reader,&read_pos,stop,&child_id,&child_size);
        lVar3 = child_size;
        lVar2 = read_pos;
        if (lVar5 < 0) break;
        switch(child_id) {
        case 0x55b1:
          lVar5 = UnserializeUInt(reader,read_pos,child_size);
          *(long *)colour_ptr._M_t.
                   super___uniq_ptr_impl<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_mkvparser::Colour_*,_std::default_delete<mkvparser::Colour>_>
                   .super__Head_base<0UL,_mkvparser::Colour_*,_false>._M_head_impl = lVar5;
          break;
        case 0x55b2:
          lVar5 = UnserializeUInt(reader,read_pos,child_size);
          *(long *)((long)colour_ptr._M_t.
                          super___uniq_ptr_impl<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_mkvparser::Colour_*,_std::default_delete<mkvparser::Colour>_>
                          .super__Head_base<0UL,_mkvparser::Colour_*,_false>._M_head_impl + 8) =
               lVar5;
          break;
        case 0x55b3:
          lVar5 = UnserializeUInt(reader,read_pos,child_size);
          *(long *)((long)colour_ptr._M_t.
                          super___uniq_ptr_impl<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_mkvparser::Colour_*,_std::default_delete<mkvparser::Colour>_>
                          .super__Head_base<0UL,_mkvparser::Colour_*,_false>._M_head_impl + 0x10) =
               lVar5;
          break;
        case 0x55b4:
          lVar5 = UnserializeUInt(reader,read_pos,child_size);
          *(long *)((long)colour_ptr._M_t.
                          super___uniq_ptr_impl<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_mkvparser::Colour_*,_std::default_delete<mkvparser::Colour>_>
                          .super__Head_base<0UL,_mkvparser::Colour_*,_false>._M_head_impl + 0x18) =
               lVar5;
          break;
        case 0x55b5:
          lVar5 = UnserializeUInt(reader,read_pos,child_size);
          *(long *)((long)colour_ptr._M_t.
                          super___uniq_ptr_impl<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_mkvparser::Colour_*,_std::default_delete<mkvparser::Colour>_>
                          .super__Head_base<0UL,_mkvparser::Colour_*,_false>._M_head_impl + 0x20) =
               lVar5;
          break;
        case 0x55b6:
          lVar5 = UnserializeUInt(reader,read_pos,child_size);
          *(long *)((long)colour_ptr._M_t.
                          super___uniq_ptr_impl<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_mkvparser::Colour_*,_std::default_delete<mkvparser::Colour>_>
                          .super__Head_base<0UL,_mkvparser::Colour_*,_false>._M_head_impl + 0x28) =
               lVar5;
          break;
        case 0x55b7:
          lVar5 = UnserializeUInt(reader,read_pos,child_size);
          *(long *)((long)colour_ptr._M_t.
                          super___uniq_ptr_impl<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_mkvparser::Colour_*,_std::default_delete<mkvparser::Colour>_>
                          .super__Head_base<0UL,_mkvparser::Colour_*,_false>._M_head_impl + 0x30) =
               lVar5;
          break;
        case 0x55b8:
          lVar5 = UnserializeUInt(reader,read_pos,child_size);
          *(long *)((long)colour_ptr._M_t.
                          super___uniq_ptr_impl<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_mkvparser::Colour_*,_std::default_delete<mkvparser::Colour>_>
                          .super__Head_base<0UL,_mkvparser::Colour_*,_false>._M_head_impl + 0x38) =
               lVar5;
          break;
        case 0x55b9:
          lVar5 = UnserializeUInt(reader,read_pos,child_size);
          *(long *)((long)colour_ptr._M_t.
                          super___uniq_ptr_impl<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_mkvparser::Colour_*,_std::default_delete<mkvparser::Colour>_>
                          .super__Head_base<0UL,_mkvparser::Colour_*,_false>._M_head_impl + 0x40) =
               lVar5;
          break;
        case 0x55ba:
          lVar5 = UnserializeUInt(reader,read_pos,child_size);
          *(long *)((long)colour_ptr._M_t.
                          super___uniq_ptr_impl<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_mkvparser::Colour_*,_std::default_delete<mkvparser::Colour>_>
                          .super__Head_base<0UL,_mkvparser::Colour_*,_false>._M_head_impl + 0x48) =
               lVar5;
          break;
        case 0x55bb:
          lVar5 = UnserializeUInt(reader,read_pos,child_size);
          *(long *)((long)colour_ptr._M_t.
                          super___uniq_ptr_impl<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_mkvparser::Colour_*,_std::default_delete<mkvparser::Colour>_>
                          .super__Head_base<0UL,_mkvparser::Colour_*,_false>._M_head_impl + 0x50) =
               lVar5;
          break;
        case 0x55bc:
          lVar5 = UnserializeUInt(reader,read_pos,child_size);
          *(long *)((long)colour_ptr._M_t.
                          super___uniq_ptr_impl<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_mkvparser::Colour_*,_std::default_delete<mkvparser::Colour>_>
                          .super__Head_base<0UL,_mkvparser::Colour_*,_false>._M_head_impl + 0x58) =
               lVar5;
          break;
        case 0x55bd:
          lVar5 = UnserializeUInt(reader,read_pos,child_size);
          *(long *)((long)colour_ptr._M_t.
                          super___uniq_ptr_impl<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_mkvparser::Colour_*,_std::default_delete<mkvparser::Colour>_>
                          .super__Head_base<0UL,_mkvparser::Colour_*,_false>._M_head_impl + 0x60) =
               lVar5;
          break;
        default:
          goto switchD_00116c98_caseD_55be;
        case 0x55d0:
          bVar4 = MasteringMetadata::Parse
                            (reader,read_pos,child_size,
                             (MasteringMetadata **)
                             ((long)colour_ptr._M_t.
                                    super___uniq_ptr_impl<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_mkvparser::Colour_*,_std::default_delete<mkvparser::Colour>_>
                                    .super__Head_base<0UL,_mkvparser::Colour_*,_false>._M_head_impl
                             + 0x68));
          if (bVar4) goto LAB_00116eac;
          goto switchD_00116c98_caseD_55be;
        }
        if (lVar5 < 0) break;
LAB_00116eac:
        read_pos = lVar2 + lVar3;
      } while (read_pos <= stop);
    }
switchD_00116c98_caseD_55be:
    std::unique_ptr<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_>::~unique_ptr
              (&colour_ptr);
  }
  return bVar6;
}

Assistant:

bool Colour::Parse(IMkvReader* reader, long long colour_start,
                   long long colour_size, Colour** colour) {
  if (!reader || *colour)
    return false;

  std::unique_ptr<Colour> colour_ptr(new (std::nothrow) Colour());
  if (!colour_ptr)
    return false;

  const long long colour_end = colour_start + colour_size;
  long long read_pos = colour_start;

  while (read_pos < colour_end) {
    long long child_id = 0;
    long long child_size = 0;

    const long status =
        ParseElementHeader(reader, read_pos, colour_end, child_id, child_size);
    if (status < 0)
      return false;

    if (child_id == libwebm::kMkvMatrixCoefficients) {
      colour_ptr->matrix_coefficients =
          UnserializeUInt(reader, read_pos, child_size);
      if (colour_ptr->matrix_coefficients < 0)
        return false;
    } else if (child_id == libwebm::kMkvBitsPerChannel) {
      colour_ptr->bits_per_channel =
          UnserializeUInt(reader, read_pos, child_size);
      if (colour_ptr->bits_per_channel < 0)
        return false;
    } else if (child_id == libwebm::kMkvChromaSubsamplingHorz) {
      colour_ptr->chroma_subsampling_horz =
          UnserializeUInt(reader, read_pos, child_size);
      if (colour_ptr->chroma_subsampling_horz < 0)
        return false;
    } else if (child_id == libwebm::kMkvChromaSubsamplingVert) {
      colour_ptr->chroma_subsampling_vert =
          UnserializeUInt(reader, read_pos, child_size);
      if (colour_ptr->chroma_subsampling_vert < 0)
        return false;
    } else if (child_id == libwebm::kMkvCbSubsamplingHorz) {
      colour_ptr->cb_subsampling_horz =
          UnserializeUInt(reader, read_pos, child_size);
      if (colour_ptr->cb_subsampling_horz < 0)
        return false;
    } else if (child_id == libwebm::kMkvCbSubsamplingVert) {
      colour_ptr->cb_subsampling_vert =
          UnserializeUInt(reader, read_pos, child_size);
      if (colour_ptr->cb_subsampling_vert < 0)
        return false;
    } else if (child_id == libwebm::kMkvChromaSitingHorz) {
      colour_ptr->chroma_siting_horz =
          UnserializeUInt(reader, read_pos, child_size);
      if (colour_ptr->chroma_siting_horz < 0)
        return false;
    } else if (child_id == libwebm::kMkvChromaSitingVert) {
      colour_ptr->chroma_siting_vert =
          UnserializeUInt(reader, read_pos, child_size);
      if (colour_ptr->chroma_siting_vert < 0)
        return false;
    } else if (child_id == libwebm::kMkvRange) {
      colour_ptr->range = UnserializeUInt(reader, read_pos, child_size);
      if (colour_ptr->range < 0)
        return false;
    } else if (child_id == libwebm::kMkvTransferCharacteristics) {
      colour_ptr->transfer_characteristics =
          UnserializeUInt(reader, read_pos, child_size);
      if (colour_ptr->transfer_characteristics < 0)
        return false;
    } else if (child_id == libwebm::kMkvPrimaries) {
      colour_ptr->primaries = UnserializeUInt(reader, read_pos, child_size);
      if (colour_ptr->primaries < 0)
        return false;
    } else if (child_id == libwebm::kMkvMaxCLL) {
      colour_ptr->max_cll = UnserializeUInt(reader, read_pos, child_size);
      if (colour_ptr->max_cll < 0)
        return false;
    } else if (child_id == libwebm::kMkvMaxFALL) {
      colour_ptr->max_fall = UnserializeUInt(reader, read_pos, child_size);
      if (colour_ptr->max_fall < 0)
        return false;
    } else if (child_id == libwebm::kMkvMasteringMetadata) {
      if (!MasteringMetadata::Parse(reader, read_pos, child_size,
                                    &colour_ptr->mastering_metadata))
        return false;
    } else {
      return false;
    }

    read_pos += child_size;
    if (read_pos > colour_end)
      return false;
  }
  *colour = colour_ptr.release();
  return true;
}